

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::TestClosing(ColladaParser *this,char *pName)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *pbVar4;
  undefined4 extraout_var_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_4f0 [376];
  string local_378;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_358 [376];
  string local_1e0;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1b0 [376];
  string local_38;
  char *local_18;
  char *pName_local;
  ColladaParser *this_local;
  
  local_18 = pName;
  pName_local = (char *)this;
  uVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar1 & 1) != 0) {
    return;
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar2 == 2) {
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),local_18);
    if (iVar2 == 0) {
      return;
    }
  }
  uVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((uVar1 & 1) != 0) {
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if ((iVar2 == 3) && (uVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (uVar1 & 1) == 0)) {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_358);
      pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(local_358,(char (*) [46])"Unexpected end of file while reading end of <");
      pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar3,&local_18);
      pbVar4 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar3,(char (*) [11])0xbb7096);
      Formatter::basic_formatter::operator_cast_to_string(&local_1e0,pbVar4);
      ThrowException(this,&local_1e0);
    }
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar2 == 2) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),local_18);
      if (iVar2 == 0) {
        return;
      }
    }
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0);
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(local_4f0,(char (*) [18])"Expected end of <");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,&local_18);
    pbVar4 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,(char (*) [11])0xbb7096);
    Formatter::basic_formatter::operator_cast_to_string(&local_378,pbVar4);
    ThrowException(this,&local_378);
  }
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
  pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (local_1b0,(char (*) [46])"Unexpected end of file while reading end of <");
  pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar3,&local_18);
  pbVar4 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar3,(char (*) [11])0xbb7096);
  Formatter::basic_formatter::operator_cast_to_string(&local_38,pbVar4);
  ThrowException(this,&local_38);
}

Assistant:

void ColladaParser::TestClosing(const char* pName) {
    // check if we have an empty (self-closing) element
    if (mReader->isEmptyElement()) {
        return;
    }

    // check if we're already on the closing tag and return right away
    if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END && strcmp(mReader->getNodeName(), pName) == 0) {
        return;
    }

    // if not, read some more
    if (!mReader->read()) {
        ThrowException(format() << "Unexpected end of file while reading end of <" << pName << "> element.");
    }
    // whitespace in front is ok, just read again if found
    if (mReader->getNodeType() == irr::io::EXN_TEXT) {
        if (!mReader->read()) {
            ThrowException(format() << "Unexpected end of file while reading end of <" << pName << "> element.");
        }
    }

    // but this has the be the closing tag, or we're lost
    if (mReader->getNodeType() != irr::io::EXN_ELEMENT_END || strcmp(mReader->getNodeName(), pName) != 0) {
        ThrowException(format() << "Expected end of <" << pName << "> element.");
    }
}